

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyDoor::Serialize(DPolyDoor *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  FSerializer *arc_local;
  DPolyDoor *this_local;
  
  DMovePoly::Serialize(&this->super_DMovePoly,arc);
  pFVar1 = FSerializer::Enum<podoortype_t>(arc,"type",&this->m_Type);
  pFVar1 = FSerializer::operator()(pFVar1,"direction",&this->m_Direction);
  pFVar1 = FSerializer::operator()(pFVar1,"totaldist",&this->m_TotalDist);
  pFVar1 = FSerializer::operator()(pFVar1,"tics",&this->m_Tics);
  pFVar1 = FSerializer::operator()(pFVar1,"waittics",&this->m_WaitTics);
  FSerializer::operator()(pFVar1,"close",&this->m_Close);
  return;
}

Assistant:

void DPolyDoor::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("direction", m_Direction)
		("totaldist", m_TotalDist)
		("tics", m_Tics)
		("waittics", m_WaitTics)
		("close", m_Close);
}